

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O0

double __thiscall wasm::Literal::ceil(Literal *this,double __x)

{
  BasicType BVar1;
  Literal *in_RSI;
  float fVar2;
  undefined4 extraout_XMM0_Db;
  double extraout_XMM0_Qa;
  double dVar3;
  double extraout_XMM0_Qa_00;
  Literal *this_local;
  
  BVar1 = wasm::Type::getBasic(&in_RSI->type);
  if (BVar1 == f32) {
    fVar2 = getf32(in_RSI);
    dVar3 = std::ceil((double)CONCAT44(extraout_XMM0_Db,fVar2));
    Literal(this,SUB84(dVar3,0));
    dVar3 = extraout_XMM0_Qa;
  }
  else {
    if (BVar1 != f64) {
      handle_unreachable("unexpected type",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/literal.cpp"
                         ,0x378);
    }
    dVar3 = getf64(in_RSI);
    dVar3 = ::ceil(dVar3);
    Literal(this,dVar3);
    dVar3 = extraout_XMM0_Qa_00;
  }
  return dVar3;
}

Assistant:

Literal Literal::ceil() const {
  switch (type.getBasic()) {
    case Type::f32:
      return Literal(std::ceil(getf32()));
    case Type::f64:
      return Literal(std::ceil(getf64()));
    default:
      WASM_UNREACHABLE("unexpected type");
  }
}